

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QCommonArrayOps<QString>::appendIteratorRange<QSet<QString>::const_iterator>
          (QCommonArrayOps<QString> *this,const_iterator *b,const_iterator *e,
          IfIsForwardIterator<QSet<QString>::const_iterator> param_4)

{
  byte bVar1;
  bool bVar2;
  byte in_CL;
  const_iterator *in_RDX;
  QArrayDataPointer<QString> *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QString *iter;
  qsizetype distance;
  QString *in_stack_ffffffffffffff88;
  QString *local_58;
  const_iterator *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffb8;
  const_iterator local_28;
  const_iterator local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_CL & 1;
  QSet<QString>::const_iterator::const_iterator(&local_18,(const_iterator *)in_RSI);
  QSet<QString>::const_iterator::const_iterator(&local_28,in_RDX);
  std::distance<QSet<QString>::const_iterator>
            ((const_iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffb8),in_stack_ffffffffffffffb0);
  local_58 = QArrayDataPointer<QString>::end(in_RSI);
  while( true ) {
    bVar2 = QSet<QString>::const_iterator::operator!=
                      ((const_iterator *)in_RSI,(const_iterator *)in_stack_ffffffffffffff88);
    if (!bVar2) break;
    in_stack_ffffffffffffff88 = local_58;
    QSet<QString>::const_iterator::operator*((const_iterator *)0x269ab5);
    QString::QString((QString *)in_RSI,in_stack_ffffffffffffff88);
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    local_58 = local_58 + 1;
    QSet<QString>::const_iterator::operator++((const_iterator *)in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void appendIteratorRange(It b, It e, QtPrivate::IfIsForwardIterator<It> = true)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        const qsizetype distance = std::distance(b, e);
        Q_ASSERT(distance >= 0 && distance <= this->allocatedCapacity() - this->size);
        Q_UNUSED(distance);

#if __cplusplus >= 202002L && defined(__cpp_concepts) && defined(__cpp_lib_concepts)
        constexpr bool canUseCopyAppend =
                std::contiguous_iterator<It> &&
                std::is_same_v<
                    std::remove_cv_t<typename std::iterator_traits<It>::value_type>,
                    T
                >;
        if constexpr (canUseCopyAppend) {
            this->copyAppend(std::to_address(b), std::to_address(e));
        } else
#endif
        {
            T *iter = this->end();
            for (; b != e; ++iter, ++b) {
                new (iter) T(*b);
                ++this->size;
            }
        }
    }